

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

int CaptureSummary::compare_string(char *x,char *y)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    bVar1 = x[lVar4];
    bVar2 = y[lVar4];
    if ((bVar1 == 0) || (bVar1 != bVar2)) break;
    lVar4 = lVar4 + 1;
  }
  iVar3 = 1;
  if (bVar2 <= bVar1) {
    iVar3 = -(uint)(bVar2 < bVar1);
  }
  return iVar3;
}

Assistant:

int CaptureSummary::compare_string(char const * x, char const * y)
{
    int ret = 0;
    uint8_t ux, uy;

    while (*x == *y && *x != 0)
    {
        x++;
        y++;
    }

    ux = (uint8_t)*x;
    uy = (uint8_t)*y;

    if (ux < uy)
    {
        ret = 1;
    }
    else if (ux > uy)
    {
        ret = -1;
    }

    return ret;
}